

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O0

bool __thiscall test_CESkyCoord::test_Convert2Observed(test_CESkyCoord *this)

{
  byte bVar1;
  long *in_RDI;
  CEDate *date;
  CESkyCoord ecl2obs;
  CESkyCoord obs2obs;
  CESkyCoord gal2obs;
  CESkyCoord icrs2obs;
  CESkyCoord cirs2obs;
  CESkyCoord testobs;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  undefined8 in_stack_fffffffffffffbd0;
  CEDateType date_format;
  allocator *paVar2;
  double in_stack_fffffffffffffbd8;
  long *plVar3;
  CEDate *in_stack_fffffffffffffbe0;
  CEObserver *in_stack_fffffffffffffbe8;
  CEObserver *observer;
  CEObserver *in_stack_fffffffffffffbf0;
  CEDate *pCVar4;
  CESkyCoord *in_stack_fffffffffffffbf8;
  CEObserver *pCVar5;
  CESkyCoord *pCVar6;
  CESkyCoord *pCVar7;
  CEAngle *in_stack_fffffffffffffc28;
  CEAngle *hour_angle;
  CESkyCoord *in_stack_fffffffffffffc30;
  CESkyCoord *out_observed;
  undefined4 local_390;
  allocator local_389;
  string local_388 [32];
  undefined4 local_368;
  allocator local_361;
  string local_360 [32];
  undefined1 local_340 [48];
  undefined4 local_310;
  undefined1 local_309 [273];
  undefined1 local_1f8 [48];
  undefined4 local_1c8;
  allocator<char> local_1c1;
  string local_1c0 [24];
  CEAngle *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  CEObserver *in_stack_fffffffffffffe68;
  CEDate *in_stack_fffffffffffffe70;
  CESkyCoord *in_stack_fffffffffffffe78;
  CESkyCoord *in_stack_fffffffffffffe80;
  undefined1 local_178 [48];
  undefined4 local_148;
  undefined1 local_141 [33];
  undefined4 local_120;
  undefined1 local_119 [33];
  undefined1 local_f8 [48];
  undefined4 local_c8;
  undefined1 local_c1 [33];
  undefined4 local_a0;
  allocator local_99;
  string local_98 [48];
  undefined1 local_68 [48];
  undefined1 local_38 [56];
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  CESkyCoord::CESkyCoord((CESkyCoord *)in_stack_fffffffffffffbe0);
  CESkyCoord::ConvertToObserved
            (in_stack_fffffffffffffbf8,(CEDate *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"test_Convert2Observed",&local_99);
  local_a0 = 0x138;
  (**(code **)(*in_RDI + 200))(in_RDI,local_68,in_RDI + 0x56,local_98,&local_a0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  CESkyCoord::CIRS2Observed
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68,
             (CESkyCoord *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  out_observed = (CESkyCoord *)(in_RDI + 0x56);
  pCVar7 = (CESkyCoord *)local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_c1 + 1),"test_Convert2Observed",(allocator *)pCVar7)
  ;
  local_c8 = 0x13b;
  (**(code **)(*in_RDI + 200))(in_RDI,local_38,out_observed,local_c1 + 1,&local_c8);
  std::__cxx11::string::~string((string *)(local_c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c1);
  CESkyCoord::ConvertToObserved
            (in_stack_fffffffffffffbf8,(CEDate *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
            );
  pCVar5 = (CEObserver *)(in_RDI + 0x56);
  pCVar4 = (CEDate *)local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_119 + 1),"test_Convert2Observed",(allocator *)pCVar4);
  local_120 = 0x13f;
  (**(code **)(*in_RDI + 200))(in_RDI,local_f8,pCVar5,local_119 + 1,&local_120);
  std::__cxx11::string::~string((string *)(local_119 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_119);
  CESkyCoord::ICRS2Observed
            (pCVar7,out_observed,pCVar4,pCVar5,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  hour_angle = (CEAngle *)(in_RDI + 0x56);
  pCVar6 = (CESkyCoord *)local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_141 + 1),"test_Convert2Observed",(allocator *)pCVar6);
  local_148 = 0x142;
  (**(code **)(*in_RDI + 200))(in_RDI,local_38,hour_angle,local_141 + 1,&local_148);
  std::__cxx11::string::~string((string *)(local_141 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_141);
  CESkyCoord::ConvertToObserved
            (in_stack_fffffffffffffbf8,(CEDate *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe68,"test_Convert2Observed",
             (allocator *)&stack0xfffffffffffffe67);
  (**(code **)(*in_RDI + 200))
            (in_RDI,local_178,in_RDI + 0x56,&stack0xfffffffffffffe68,&stack0xfffffffffffffe60);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
  CESkyCoord::Galactic2Observed(pCVar7,out_observed,pCVar4,pCVar5,pCVar6,hour_angle);
  pCVar6 = (CESkyCoord *)(in_RDI + 0x56);
  pCVar7 = (CESkyCoord *)&local_1c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"test_Convert2Observed",(allocator *)pCVar7);
  local_1c8 = 0x149;
  (**(code **)(*in_RDI + 200))(in_RDI,local_38,pCVar6,local_1c0,&local_1c8);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pCVar5 = (CEObserver *)(in_RDI + 0x56);
  date = (CEDate *)CEDate::CurrentJD();
  CEDate::CEDate(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,date_format);
  CEObserver::CEObserver(in_stack_fffffffffffffbf0);
  CESkyCoord::ConvertToObserved
            ((CESkyCoord *)pCVar5,(CEDate *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  CEObserver::~CEObserver
            ((CEObserver *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
  CEDate::~CEDate((CEDate *)0x1226e8);
  observer = (CEObserver *)(in_RDI + 0x56);
  pCVar4 = (CEDate *)local_309;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_309 + 1),"test_Convert2Observed",(allocator *)pCVar4);
  local_310 = 0x14d;
  (**(code **)(*in_RDI + 200))(in_RDI,local_1f8,observer,local_309 + 1,&local_310);
  std::__cxx11::string::~string((string *)(local_309 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_309);
  CESkyCoord::ConvertToObserved((CESkyCoord *)pCVar5,pCVar4,observer);
  plVar3 = in_RDI + 0x56;
  paVar2 = &local_361;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"test_Convert2Observed",paVar2);
  local_368 = 0x151;
  (**(code **)(*in_RDI + 200))(in_RDI,local_340,plVar3,local_360,&local_368);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  CESkyCoord::Ecliptic2Observed(pCVar7,pCVar6,date,pCVar5);
  paVar2 = &local_389;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"test_Convert2Observed",paVar2);
  local_390 = 0x154;
  (**(code **)(*in_RDI + 200))(in_RDI,local_340,in_RDI + 0x56,local_388,&local_390);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar1,in_stack_fffffffffffffbc0));
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar1,in_stack_fffffffffffffbc0));
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar1,in_stack_fffffffffffffbc0));
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar1,in_stack_fffffffffffffbc0));
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar1,in_stack_fffffffffffffbc0));
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar1,in_stack_fffffffffffffbc0));
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CESkyCoord::test_Convert2Observed()
{
    // Preliminary variable for observer based conversion
    CESkyCoord testobs;

    // CIRS -> Observed
    CESkyCoord cirs2obs = base_cirs_.ConvertToObserved(base_date_, base_observer_);
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::CIRS2Observed(base_cirs_, &testobs, base_date_, base_observer_);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // ICRS -> Observed
    CESkyCoord icrs2obs = base_icrs_.ConvertToObserved(base_date_, base_observer_);
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::ICRS2Observed(base_icrs_, &testobs, base_date_, base_observer_);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Galactic -> Observed
    CESkyCoord gal2obs = base_gal_.ConvertToObserved(base_date_, base_observer_);
    test_coords(gal2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::Galactic2Observed(base_gal_, &testobs, base_date_, base_observer_);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Observed -> Observed
    CESkyCoord obs2obs = base_obs_.ConvertToObserved();
    test_coords(obs2obs, base_obs_, __func__, __LINE__);

    // Ecliptic -> Observed
    CESkyCoord ecl2obs = base_ecl_.ConvertToObserved(base_date_, base_observer_);
    test_coords(ecl2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::Ecliptic2Observed(base_ecl_, &ecl2obs, base_date_, base_observer_);
    test_coords(ecl2obs, base_obs_, __func__, __LINE__);

    return pass();
}